

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
::try_emplace_impl_with_hash<int_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
          *this,size_t hashval,int *k)

{
  _Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_false>
  *this_00;
  size_t sVar1;
  __tuple_element_t<0UL,_tuple<Inner_*,_unsigned_long,_bool>_>_conflict8 inner_00;
  ctrl_t h;
  __tuple_element_t<0UL,_tuple<Inner_*,_unsigned_long,_bool>_>_conflict8 *ppIVar2;
  __tuple_element_t<2UL,_tuple<Inner_*,_unsigned_long,_bool>_> *p_Var3;
  EmbeddedSet *pEVar4;
  __tuple_element_t<1UL,_tuple<Inner_*,_unsigned_long,_bool>_> *p_Var5;
  iterator local_b0;
  iterator local_a0;
  tuple<> local_69;
  tuple<const_int_&> local_68;
  __tuple_element_t<0UL,_tuple<Inner_*,_unsigned_long,_bool>_>_conflict8 local_60;
  Inner *inner;
  undefined1 local_48 [8];
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
  res;
  UniqueLock m;
  int *k_local;
  size_t hashval_local;
  parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *this_local;
  
  this_00 = &res.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
             .
             super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_false>
  ;
  LockableBaseImpl<std::mutex>::WriteLock::WriteLock((WriteLock *)this_00);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::find_or_prepare_insert_with_hash<int>
            ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
              *)local_48,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
              *)this,hashval,k,(UniqueLock *)this_00);
  ppIVar2 = std::
            get<0ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::Inner*,unsigned_long,bool>
                      ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
                        *)local_48);
  local_60 = *ppIVar2;
  p_Var3 = std::
           get<2ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::Inner*,unsigned_long,bool>
                     ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
                       *)local_48);
  if ((*p_Var3 & 1U) != 0) {
    pEVar4 = &local_60->set_;
    p_Var5 = std::
             get<1ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::Inner*,unsigned_long,bool>
                       ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
                         *)local_48);
    sVar1 = *p_Var5;
    std::forward_as_tuple<int_const&>((int *)&local_68);
    std::forward_as_tuple<>();
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
                *)pEVar4,sVar1,(piecewise_construct_t *)&std::piecewise_construct,&local_68,
               &local_69);
    pEVar4 = &local_60->set_;
    p_Var5 = std::
             get<1ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::Inner*,unsigned_long,bool>
                       ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
                         *)local_48);
    sVar1 = *p_Var5;
    h = H2(hashval);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
    ::set_ctrl(pEVar4,sVar1,h);
  }
  inner_00 = local_60;
  pEVar4 = &local_60->set_;
  p_Var5 = std::
           get<1ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::Inner*,unsigned_long,bool>
                     ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
                       *)local_48);
  local_b0 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             ::iterator_at(pEVar4,*p_Var5);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::iterator_at(&local_a0,
                (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                 *)this,inner_00,&local_b0);
  p_Var3 = std::
           get<2ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::Inner*,unsigned_long,bool>
                     ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
                       *)local_48);
  std::
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
  ::
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool_&,_true>
            (__return_storage_ptr__,&local_a0,p_Var3);
  LockableBaseImpl<std::mutex>::WriteLock::~WriteLock
            ((WriteLock *)
             &res.
              super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_unsigned_long,_bool>
              .
              super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::Inner_*,_false>
            );
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl_with_hash(size_t hashval, K&& k, Args&&... args) {
        UniqueLock m;
        auto res = this->find_or_prepare_insert_with_hash(hashval, k, m);
        typename Base::Inner *inner = std::get<0>(res);
        if (std::get<2>(res)) {
            inner->set_.emplace_at(std::get<1>(res), std::piecewise_construct,
                                   std::forward_as_tuple(std::forward<K>(k)),
                                   std::forward_as_tuple(std::forward<Args>(args)...));
            inner->set_.set_ctrl(std::get<1>(res), H2(hashval));
        }
        return {this->iterator_at(inner, inner->set_.iterator_at(std::get<1>(res))), 
                std::get<2>(res)};
    }